

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall van_kampen::Graph::printSelf(Graph *this,ostream *os,graphOutputFormat fmt)

{
  const_iterator cVar1;
  _Map_pointer ppNVar2;
  ulong uVar3;
  _Elt_pointer pNVar4;
  long lVar5;
  ulong uVar6;
  _Map_pointer ppNVar7;
  size_t i;
  ulong uVar8;
  char *pcVar9;
  _Elt_pointer pNVar10;
  _Elt_pointer pNVar11;
  Node *pNVar12;
  _Elt_pointer pNVar13;
  key_type local_38;
  key_type local_34;
  
  if (fmt == WOLFRAM_NOTEBOOK) {
    pcVar9 = "Graph[Rule @@@ {";
    lVar5 = 0x10;
LAB_00139b22:
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,lVar5);
  }
  else if (fmt == DOT) {
    pcVar9 = "digraph G {\nrankdir=LR;\nlayout=neato;\n";
    lVar5 = 0x26;
    goto LAB_00139b22;
  }
  lVar5 = 0;
  uVar8 = 0;
  while( true ) {
    ppNVar2 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    ppNVar7 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    pNVar4 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    pNVar11 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    pNVar13 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    pNVar10 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_start._M_last;
    if (((long)pNVar10 - (long)pNVar13 >> 3) * -0x2c8590b21642c859 +
        ((long)pNVar4 - (long)pNVar11 >> 3) * -0x2c8590b21642c859 +
        (((long)ppNVar2 - (long)ppNVar7 >> 3) + -1 + (ulong)(ppNVar2 == (_Map_pointer)0x0)) * 2 <=
        uVar8) break;
    local_34 = (key_type)uVar8;
    cVar1 = std::
            _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->removedNodes_)._M_h,&local_34);
    if (cVar1.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
      pNVar4 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar3 = ((long)pNVar4 -
               (long)(this->nodes_).
                     super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>._M_impl.
                     super__Deque_impl_data._M_start._M_first >> 3) * -0x2c8590b21642c859 + uVar8;
      if ((long)uVar3 < 0) {
        uVar6 = (long)uVar3 >> 1;
LAB_00139be1:
        pNVar12 = (this->nodes_).
                  super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar6] + uVar3 + uVar6 * -2;
      }
      else {
        if (1 < uVar3) {
          uVar6 = uVar3 >> 1;
          goto LAB_00139be1;
        }
        pNVar12 = (Node *)((long)&(pNVar4->position).x + lVar5);
      }
      Node::printSelf(pNVar12,os,fmt);
    }
    uVar8 = uVar8 + 1;
    lVar5 = lVar5 + 0xb8;
  }
  lVar5 = 0;
  for (uVar8 = 0;
      uVar8 < ((long)pNVar10 - (long)pNVar13 >> 3) * -0x2c8590b21642c859 +
              ((long)pNVar4 - (long)pNVar11 >> 3) * -0x2c8590b21642c859 +
              (((long)ppNVar2 - (long)ppNVar7 >> 3) + -1 + (ulong)(ppNVar2 == (_Map_pointer)0x0)) *
              2; uVar8 = uVar8 + 1) {
    local_38 = (key_type)uVar8;
    cVar1 = std::
            _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->removedNodes_)._M_h,&local_38);
    if (cVar1.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
      pNVar4 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppNVar2 = (this->nodes_).
                super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      uVar3 = ((long)pNVar4 -
               (long)(this->nodes_).
                     super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>._M_impl.
                     super__Deque_impl_data._M_start._M_first >> 3) * -0x2c8590b21642c859 + uVar8;
      if ((long)uVar3 < 0) {
        uVar6 = (long)uVar3 >> 1;
LAB_00139c9e:
        pNVar12 = ppNVar2[uVar6] + uVar3 + uVar6 * -2;
      }
      else {
        if (1 < uVar3) {
          uVar6 = uVar3 >> 1;
          goto LAB_00139c9e;
        }
        pNVar12 = (Node *)((long)&(pNVar4->position).x + lVar5);
      }
      ppNVar7 = (this->nodes_).
                super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      Node::printTransitions
                (pNVar12,os,fmt,
                 uVar8 == (((long)(this->nodes_).
                                  super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)(this->nodes_).
                                  super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                           -0x2c8590b21642c859 +
                           (((long)ppNVar7 - (long)ppNVar2 >> 3) + -1 +
                           (ulong)(ppNVar7 == (_Map_pointer)0x0)) * 2 +
                          ((long)(this->nodes_).
                                 super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pNVar4 >>
                          3) * -0x2c8590b21642c859) - 1);
    }
    ppNVar2 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    ppNVar7 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    pNVar4 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    pNVar11 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    pNVar13 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    pNVar10 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_start._M_last;
    lVar5 = lVar5 + 0xb8;
  }
  if (fmt == DOT) {
    pcVar9 = "}\n";
    lVar5 = 2;
  }
  else {
    if (fmt != WOLFRAM_NOTEBOOK) goto LAB_00139d65;
    pcVar9 = "}, GraphLayout -> \"PlanarEmbedding\"]\n";
    lVar5 = 0x25;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,lVar5);
LAB_00139d65:
  std::ostream::flush();
  return;
}

Assistant:

void Graph::printSelf(std::ostream &os, graphOutputFormat fmt) const
{
    switch (fmt)
    {
    case graphOutputFormat::DOT:
        os << "digraph G {\n"
              "rankdir=LR;\n"
              "layout=neato;\n";
        break;
    case graphOutputFormat::WOLFRAM_NOTEBOOK:
        os << "Graph[Rule @@@ {";
        break;

    case graphOutputFormat::TXT_EDGES:
        break;

    default:
        break;
    }

    for (std::size_t i = 0; i < nodes_.size(); ++i)
    {
        if (removedNodes_.find(i) != removedNodes_.end())
        {
            continue;
        }
        nodes_[i].printSelf(os, fmt);
    }
    for (std::size_t i = 0; i < nodes_.size(); ++i)
    {
        if (removedNodes_.find(i) != removedNodes_.end())
        {
            continue;
        }
        nodes_[i].printTransitions(os, fmt, i == nodes_.size() - 1);
    }

    switch (fmt)
    {
    case graphOutputFormat::DOT:
        os << "}\n";
        break;

    case graphOutputFormat::WOLFRAM_NOTEBOOK:
        os << "}, GraphLayout -> \"PlanarEmbedding\"]\n";
        break;

    case graphOutputFormat::TXT_EDGES:
        break;

    default:
        break;
    }
    os.flush();
}